

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O0

void __thiscall cinatra::coro_http_response::add_cookie(coro_http_response *this,cookie *cookie)

{
  cookie *in_RSI;
  cookie *in_stack_ffffffffffffff98;
  
  cinatra::cookie::get_name_abi_cxx11_(in_stack_ffffffffffffff98);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::cookie,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::cookie>_>_>
  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::cookie,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::cookie>_>_>
                *)in_RSI,&in_stack_ffffffffffffff98->name_);
  cinatra::cookie::operator=(in_RSI,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(&in_RSI->name_);
  return;
}

Assistant:

void add_cookie(const cookie &cookie) {
    cookies_[cookie.get_name()] = cookie;
  }